

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O2

void anon_unknown.dwarf_654bd::invertM44f(M44f *m,float e)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  M44f ident2;
  M44f ident1;
  M44f inv2;
  M44f inv1;
  
  Imath_2_5::Matrix44<float>::inverse(&inv1,m,false);
  Imath_2_5::Matrix44<float>::gjInverse(&inv2,m,false);
  Imath_2_5::Matrix44<float>::operator*(&ident1,m,&inv1);
  Imath_2_5::Matrix44<float>::operator*(&ident2,m,&inv2);
  bVar1 = Imath_2_5::Matrix44<float>::equalWithAbsError
                    (&ident1,(Matrix44<float> *)&Imath_2_5::identity44f,e);
  if (bVar1) {
    bVar1 = Imath_2_5::Matrix44<float>::equalWithAbsError
                      (&ident2,(Matrix44<float> *)&Imath_2_5::identity44f,e);
    if (bVar1) {
      return;
    }
    __assertion = "ident2.equalWithAbsError (identity44f, e)";
    __line = 0x40;
  }
  else {
    __assertion = "ident1.equalWithAbsError (identity44f, e)";
    __line = 0x3f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testInvert.cpp"
                ,__line,"void (anonymous namespace)::invertM44f(const M44f &, float)");
}

Assistant:

void
invertM44f (const M44f &m, float e)
{
    M44f inv1 = m.inverse();
    M44f inv2 = m.gjInverse();
    M44f ident1 = m * inv1;
    M44f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity44f, e));
    assert (ident2.equalWithAbsError (identity44f, e));
}